

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32_api_tests.cpp
# Opt level: O0

void encode_c1_minimalExample_isSuccessful(void)

{
  __type _Var1;
  string local_a0;
  allocator<char> local_79;
  undefined1 local_78 [8];
  string expected;
  vector<unsigned_char,_std::allocator<unsigned_char>_> dp;
  allocator<char> local_29;
  undefined1 local_28 [8];
  string hrp;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_28,"a",&local_29);
  std::allocator<char>::~allocator(&local_29);
  expected.field_2._8_8_ = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)((long)&expected.field_2 + 8))
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_78,"a12uel5l",&local_79);
  std::allocator<char>::~allocator(&local_79);
  bech32::encodeUsingOriginalConstant
            (&local_a0,(string *)local_28,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)((long)&expected.field_2 + 8))
  ;
  _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_78,&local_a0);
  if (!_Var1) {
    __assert_fail("expected == bech32::encodeUsingOriginalConstant(hrp, dp)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/testbech32/bech32_api_tests.cpp"
                  ,0xc1,"void encode_c1_minimalExample_isSuccessful()");
  }
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)local_78);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)((long)&expected.field_2 + 8))
  ;
  std::__cxx11::string::~string((string *)local_28);
  return;
}

Assistant:

void encode_c1_minimalExample_isSuccessful() {
    std::string hrp = "a";
    std::vector<unsigned char> dp = {};
    std::string expected = "a12uel5l";

    assert(expected == bech32::encodeUsingOriginalConstant(hrp, dp));
}